

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

C_Node * expr_stmt(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  C_Node *pCVar2;
  C_Node *pCVar3;
  C_Token *pCVar4;
  C_Token *tok_local;
  
  tok_local = tok;
  _Var1 = C_equal(tok,";");
  if (_Var1) {
    *rest = tok->next;
    pCVar2 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar2->kind = ND_BLOCK;
    pCVar2->tok = tok;
  }
  else {
    pCVar2 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar2->kind = ND_EXPR_STMT;
    pCVar2->tok = tok;
    pCVar3 = expr(parser,&tok_local,tok);
    pCVar2->lhs = pCVar3;
    pCVar4 = C_skip(parser,tok_local,";");
    *rest = pCVar4;
  }
  return pCVar2;
}

Assistant:

static C_Node *expr_stmt(C_Parser *parser, C_Token **rest, C_Token *tok) {
  if (C_equal(tok, ";")) {
    *rest = tok->next;
    return new_node(parser, ND_BLOCK, tok);
  }

  C_Node *node = new_node(parser, ND_EXPR_STMT, tok);
  node->lhs = expr(parser, &tok, tok);
  *rest = C_skip(parser, tok, ";");
  return node;
}